

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O0

int nn_surveyor_create(void *hint,nn_sockbase **sockbase)

{
  void *pvVar1;
  undefined8 *in_RSI;
  nn_sockbase_vfptr *in_RDI;
  nn_surveyor *self;
  
  pvVar1 = nn_alloc_(0x2f9388);
  if (pvVar1 == (void *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/surveyor.c"
            ,0x1fa);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_surveyor_init(self,in_RDI,in_RSI);
  *in_RSI = pvVar1;
  return 0;
}

Assistant:

static int nn_surveyor_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_surveyor *self;

    self = nn_alloc (sizeof (struct nn_surveyor), "socket (surveyor)");
    alloc_assert (self);
    nn_surveyor_init (self, &nn_surveyor_sockbase_vfptr, hint);
    *sockbase = &self->xsurveyor.sockbase;

    return 0;
}